

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O0

void set_suite::test_int_two(void)

{
  iterator iVar1;
  iterator iVar2;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar3;
  undefined4 local_130;
  undefined1 local_12c;
  undefined1 local_12b [3];
  output_type expected [5];
  value_type_conflict2 local_114;
  _Base_ptr local_110;
  undefined1 local_108;
  value_type_conflict2 local_fc;
  undefined1 local_f8 [8];
  set<int,_std::less<int>,_std::allocator<int>_> value;
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_f8);
  local_fc = 0x11;
  pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_f8,&local_fc);
  local_110 = (_Base_ptr)pVar3.first._M_node;
  local_108 = pVar3.second;
  local_114 = 0x22;
  pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_f8,&local_114);
  _expected = pVar3.first._M_node;
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,
             (set<int,_std::less<int>,_std::allocator<int>_> *)local_f8);
  local_12c = 0x93;
  local_130 = 0x22118292;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_std_suite.cpp"
             ,0x2be,"void set_suite::test_int_two()",iVar1._M_current,iVar2._M_current,&local_130,
             local_12b);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_f8);
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_int_two()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    std::set<int> value;
    value.insert(0x11);
    value.insert(0x22);
    ar << value;

    output_type expected[] = { token::code::begin_array,
                              token::code::null,
                              0x11,
                              0x22,
                              token::code::end_array };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}